

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<JointPolicyPureVectorForClusteredBG>
boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
          (shared_ptr<PartialJointPolicyDiscretePure> *r)

{
  element_type *this;
  shared_ptr<PartialJointPolicyDiscretePure> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<PartialJointPolicyDiscretePure> *in_RSI;
  element_type *in_RDI;
  shared_ptr<JointPolicyPureVectorForClusteredBG> sVar2;
  E *p;
  
  this = shared_ptr<PartialJointPolicyDiscretePure>::get(in_RSI);
  if (this == (element_type *)0x0) {
    r_00 = (shared_ptr<PartialJointPolicyDiscretePure> *)0x0;
  }
  else {
    r_00 = (shared_ptr<PartialJointPolicyDiscretePure> *)
           __dynamic_cast(this,&PartialJointPolicyDiscretePure::typeinfo,
                          &JointPolicyPureVectorForClusteredBG::typeinfo,0);
  }
  if (r_00 == (shared_ptr<PartialJointPolicyDiscretePure> *)0x0) {
    shared_ptr<JointPolicyPureVectorForClusteredBG>::shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x8d257f);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<JointPolicyPureVectorForClusteredBG>::shared_ptr<PartialJointPolicyDiscretePure>
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)this,r_00,(element_type *)0x8d2573
              );
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}